

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButton::setDefaultAction(QToolButton *this,QAction *action)

{
  undefined1 *puVar1;
  long *plVar2;
  QToolButtonPrivate *this_00;
  bool bVar3;
  long lVar4;
  undefined1 *puVar5;
  QList<QAction_*> *pQVar6;
  long in_FS_OFFSET;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QList<QAction_*> local_58;
  QString local_40;
  long local_28;
  
  pQVar6 = &local_58;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QToolButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar3 = QToolButtonPrivate::hasMenu(this_00);
  this_00->defaultAction = action;
  if (action == (QAction *)0x0) goto LAB_004c2c44;
  QWidget::actions(&local_58,(QWidget *)this);
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_004c2a18:
    pQVar6 = (QList<QAction_*> *)0xffffffffffffffff;
  }
  else {
    puVar5 = (undefined1 *)0xfffffffffffffff8;
    do {
      puVar1 = puVar5 + local_58.d.size * -8;
      if (puVar1 == (undefined1 *)0xfffffffffffffff8) goto LAB_004c2a12;
      pQVar6 = (QList<QAction_*> *)(puVar5 + 8);
      plVar2 = (long *)((long)(local_58.d.ptr + 1) + (long)puVar5);
      puVar5 = (undefined1 *)pQVar6;
    } while ((QAction *)*plVar2 != action);
    pQVar6 = (QList<QAction_*> *)((long)pQVar6 >> 3);
LAB_004c2a12:
    if (puVar1 == (undefined1 *)0xfffffffffffffff8) goto LAB_004c2a18;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (pQVar6 == (QList<QAction_*> *)0xffffffffffffffff) {
    QWidget::addAction((QWidget *)this,action);
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  QAction::iconText();
  if (*(long *)(*(long *)(action + 8) + 0xb0) == 0) {
    QVar7.m_data = (char *)0x1;
    QVar7.m_size = (qsizetype)&local_58;
    QVar8.m_data = (char *)0x2;
    QVar8.m_size = (qsizetype)"&";
    QString::replace(QVar7,QVar8,0x6e2914);
  }
  QAbstractButton::setText(&this->super_QAbstractButton,(QString *)&local_58);
  QAction::icon();
  QAbstractButton::setIcon(&this->super_QAbstractButton,(QIcon *)&local_40);
  QIcon::~QIcon((QIcon *)&local_40);
  QAction::toolTip();
  QWidget::setToolTip((QWidget *)this,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  QAction::statusTip();
  QWidget::setStatusTip((QWidget *)this,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  QAction::whatsThis();
  QWidget::setWhatsThis((QWidget *)this,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  QAction::menuObject();
  lVar4 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  if (!bVar3 && lVar4 != 0) {
    *(undefined4 *)(*(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8 + 0x2e8) = 1;
  }
  bVar3 = (bool)QAction::isCheckable();
  QAbstractButton::setCheckable(&this->super_QAbstractButton,bVar3);
  bVar3 = (bool)QAction::isChecked();
  QAbstractButton::setChecked(&this->super_QAbstractButton,bVar3);
  bVar3 = (bool)QAction::isEnabled();
  QWidget::setEnabled((QWidget *)this,bVar3);
  if ((*(byte *)(*(long *)(action + 8) + 0x189) & 1) != 0) {
    QAction::font();
    QWidget::setFont((QWidget *)this,(QFont *)&local_40);
    QFont::~QFont((QFont *)&local_40);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_004c2c44:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::setDefaultAction(QAction *action)
{
    Q_D(QToolButton);
#if QT_CONFIG(menu)
    bool hadMenu = false;
    hadMenu = d->hasMenu();
#endif
    d->defaultAction = action;
    if (!action)
        return;
    if (!actions().contains(action))
        addAction(action);
    QString buttonText = action->iconText();
    // If iconText() is generated from text(), we need to escape any '&'s so they
    // don't turn into shortcuts
    if (QActionPrivate::get(action)->iconText.isEmpty())
        buttonText.replace("&"_L1, "&&"_L1);
    setText(buttonText);
    setIcon(action->icon());
#if QT_CONFIG(tooltip)
    setToolTip(action->toolTip());
#endif
#if QT_CONFIG(statustip)
    setStatusTip(action->statusTip());
#endif
#if QT_CONFIG(whatsthis)
    setWhatsThis(action->whatsThis());
#endif
#if QT_CONFIG(menu)
    if (action->menu() && !hadMenu) {
        // new 'default' popup mode defined introduced by tool bar. We
        // should have changed QToolButton's default instead. Do that
        // in 4.2.
        setPopupMode(QToolButton::MenuButtonPopup);
    }
#endif
    setCheckable(action->isCheckable());
    setChecked(action->isChecked());
    setEnabled(action->isEnabled());
    if (action->d_func()->fontSet)
        setFont(action->font());
}